

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdUVTexture *texture,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  _Base_ptr __k;
  _Any_data *p_Var1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  bool bVar5;
  bool bVar6;
  int *piVar7;
  TimeSamples *pTVar8;
  size_type sVar9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  texcoord2f *ptVar13;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
  *pvVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  texcoord2f extraout_RAX;
  texcoord2f extraout_RAX_00;
  texcoord2f tVar16;
  const_iterator cVar17;
  mapped_type *this;
  _Base_ptr p_Var18;
  void *pvVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  texcoord2f tVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_04;
  undefined8 __n;
  char *pcVar21;
  char cVar22;
  size_t i;
  ulong uVar23;
  undefined8 uVar24;
  char *pcVar25;
  Property *pPVar26;
  long lVar27;
  TypedTerminalAttribute<std::array<float,_3UL>_> *pTVar28;
  pointer pSVar29;
  undefined4 uVar30;
  ParseResult ret;
  Animatable<tinyusdz::value::texcoord2f> animatable_value;
  ParseResult ret_1;
  optional<tinyusdz::value::texcoord2f> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string attr_type_name;
  TypedTerminalAttribute<std::array<float,_3UL>_> *in_stack_fffffffffffffaf8;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [24];
  bool local_4d0;
  undefined1 local_4c8 [8];
  texcoord2f local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  bool local_4a0;
  undefined1 local_498 [8];
  texcoord2f local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  TypedTerminalAttribute<std::array<float,_3UL>_> *local_470;
  string *local_468;
  TimeSamples *local_460;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  UsdUVTexture *local_3e8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *local_3e0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *local_3d8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
  *local_3d0;
  string local_3c8;
  undefined1 local_3a8 [12];
  float fStack_39c;
  undefined1 local_398 [16];
  Variability local_388;
  undefined4 uStack_384;
  char local_380;
  undefined7 uStack_37f;
  undefined1 local_378;
  ios_base local_338 [16];
  ios_base local_328 [272];
  storage_t<tinyusdz::Token> local_218;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  TypedTerminalAttribute<float> *local_198;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  _Base_ptr local_170;
  optional<tinyusdz::value::texcoord2f> local_164;
  string local_158 [16];
  long local_148 [2];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  undefined1 auStack_80 [16];
  _Alloc_hider _Stack_70;
  code *local_68;
  undefined1 auStack_60 [16];
  _Alloc_hider _Stack_50;
  code *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  local_418._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_418._M_impl.super__Rb_tree_header._M_header;
  local_418._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_418._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_418._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468 = warn;
  local_418._M_impl.super__Rb_tree_header._M_header._M_right =
       local_418._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3a8._0_8_ = local_398;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_418,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
  if ((undefined1 *)local_3a8._0_8_ != local_398) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
  }
  p_Var18 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_170 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar10 = true;
  if (p_Var18 != local_170) {
    local_190._24_8_ = &texture->file;
    local_218._24_8_ = &texture->st;
    local_190.data._0_8_ = (undefined8)&(texture->st)._paths;
    local_218._16_8_ = &(texture->st)._attrib;
    local_190._16_8_ = &texture->outputsR;
    local_190._8_8_ = &texture->outputsG;
    local_198 = &texture->outputsB;
    local_1b8._24_8_ = &texture->outputsA;
    local_1b8._16_8_ = &texture->outputsRGB;
    local_1b8._8_8_ = &(texture->super_ShaderNode).super_UsdShadePrim.props;
    local_3e0 = &texture->wrapT;
    local_3d8 = &texture->wrapS;
    local_3d0 = &texture->sourceColorSpace;
    local_470 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
    local_3e8 = texture;
    do {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,*(long *)(p_Var18 + 1),
                 (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
      prop = (Property *)(p_Var18 + 2);
      local_3a8._0_8_ = local_398;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"inputs:file","");
      pPVar26 = (Property *)local_3a8;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::AssetPath>
                ((ParseResult *)local_4f8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_418,&local_b8,prop,(string *)local_3a8,
                 (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                 local_190._24_8_);
      if ((undefined1 *)local_3a8._0_8_ != local_398) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      iVar11 = 0;
      if ((local_4f8._0_8_ & 0xfffffffd) == 0) {
        iVar11 = 3;
LAB_00239379:
        bVar10 = false;
      }
      else {
        bVar10 = true;
        if ((float)local_4f8._0_4_ != 1.4013e-45) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3a8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xfed);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          local_498 = (undefined1  [8])(local_498 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_498,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[12],std::__cxx11::string>
                    ((string *)local_4c8,(fmt *)local_498,(string *)"inputs:file",
                     (char (*) [12])(local_4f8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar26);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,(char *)local_4c8,(long)local_4c0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if (local_4c8 != (undefined1  [8])&local_4b8) {
            operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
          }
          pTVar28 = local_470;
          if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
            operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
          }
          if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ptVar13 = (texcoord2f *)
                      ::std::__cxx11::string::_M_append
                                (local_498,(ulong)(pTVar28->_metas).interpolation);
            tVar16 = (texcoord2f)(ptVar13 + 2);
            if (*ptVar13 == tVar16) {
              local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
              tVar20 = ptVar13[3];
              local_4b8._M_local_buf[8] = tVar20.s._0_1_;
              local_4b8._M_local_buf[9] = tVar20.s._1_1_;
              local_4b8._M_local_buf[10] = tVar20.s._2_1_;
              local_4b8._11_5_ = tVar20._3_5_;
              local_4c8 = (undefined1  [8])&local_4b8;
            }
            else {
              local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
              local_4c8 = (undefined1  [8])*ptVar13;
            }
            local_4c0 = ptVar13[1];
            *ptVar13 = tVar16;
            ptVar13[1].s = 0.0;
            ptVar13[1].t = 0.0;
            *(undefined1 *)&ptVar13[2].s = 0;
            ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4c8);
            if (local_4c8 != (undefined1  [8])&local_4b8) {
              operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
            }
            if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
              operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
          ::std::ios_base::~ios_base(local_338);
          iVar11 = 1;
          goto LAB_00239379;
        }
      }
      if (local_4f8._8_8_ != (long)local_4e8 + 8) {
        operator_delete((void *)local_4f8._8_8_,
                        CONCAT44(local_4e8._12_4_,
                                 CONCAT13(local_4e8[0xb],
                                          CONCAT12(local_4e8[10],CONCAT11(local_4e8[9],local_4e8[8])
                                                  ))) + 1);
      }
      if (bVar10) {
        local_1d8._M_allocated_capacity = (size_type)&local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"inputs:st","");
        uVar24 = local_1d8._8_8_;
        sVar9 = local_3c8._M_string_length;
        local_490 = (texcoord2f)((long)local_498 + 0x18);
        local_488._M_allocated_capacity = 0;
        local_488._M_local_buf[8] = '\0';
        __n = local_1d8._8_8_;
        if (local_3c8._M_string_length < (ulong)local_1d8._8_8_) {
          __n = local_3c8._M_string_length;
        }
        if (__n == 0) {
          if (local_1d8._8_8_ == local_3c8._M_string_length) goto LAB_0023945c;
LAB_00239547:
          local_498._0_4_ = 1;
        }
        else {
          iVar11 = bcmp((void *)local_1d8._M_allocated_capacity,local_3c8._M_dataplus._M_p,__n);
          if ((uVar24 != sVar9) || (iVar11 != 0)) goto LAB_00239547;
LAB_0023945c:
          if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_498._0_4_ = 7;
            local_4c8._0_4_ = 8.26766e-44;
            local_4c8._4_4_ = 0.0;
            local_4f8._0_8_ = local_4e8;
            local_4f8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4f8,(ulong)local_4c8)
            ;
            local_4e8._0_8_ = local_4c8;
            *(undefined8 *)local_4f8._0_8_ = 0x79747265706f7250;
            *(undefined8 *)(local_4f8._0_8_ + 8) = 0x7473756d207d7b20;
            *(undefined8 *)(local_4f8._0_8_ + 0x10) = 0x7274744120656220;
            *(undefined8 *)(local_4f8._0_8_ + 0x18) = 0x62202c6574756269;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_4f8._0_8_ + 0x20))->_M_allocated_capacity = 0x616c636564207475;
            *(undefined8 *)(local_4f8._0_8_ + 0x28) = 0x5220736120646572;
            builtin_strncpy((char *)(local_4f8._0_8_ + 0x2b)," as Rela",8);
            builtin_strncpy((char *)(local_4f8._0_8_ + 0x33),"tionhip.",8);
            local_4f8._8_8_ = local_4c8;
            *(char *)(local_4f8._0_8_ + (long)local_4c8) = '\0';
            fmt::format<std::__cxx11::string>
                      ((string *)local_3a8,(fmt *)local_4f8,&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4c8);
            ::std::__cxx11::string::operator=((string *)(local_498 + 8),(string *)local_3a8);
            if ((undefined1 *)local_3a8._0_8_ != local_398) {
              operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
            }
            uVar24 = local_4e8._0_8_;
            tVar16 = (texcoord2f)local_4f8._0_8_;
            if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
LAB_00239792:
              operator_delete((void *)tVar16,uVar24 + 1);
            }
          }
          else {
            Attribute::type_name_abi_cxx11_((string *)local_1f8,(Attribute *)prop);
            local_3a8._0_8_ = local_398;
            local_398._0_8_ = (code *)0x64726f6f43786574;
            local_398[8] = '2';
            local_398[9] = 'f';
            local_3a8._8_2_ = 10;
            local_3a8._10_2_ = 0;
            fStack_39c = 0.0;
            local_398[10] = '\0';
            if ((anon_struct_8_0_00000001_for___align)local_1f8._8_8_ ==
                (anon_struct_8_0_00000001_for___align)0xa) {
              if (*(short *)(local_1f8._0_8_ + 8) != 0x6632 ||
                  *(size_type *)local_1f8._0_8_ != 0x64726f6f43786574) goto LAB_00239629;
LAB_0023a45e:
              uVar24 = p_Var18[6]._M_parent;
              aVar4 = (anon_struct_8_0_00000001_for___align)p_Var18[6]._M_left;
              if (aVar4 != (anon_struct_8_0_00000001_for___align)uVar24) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           local_190.data._0_8_,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var18[6]._M_parent);
              }
              iVar11 = *(int *)((long)&p_Var18[0x17]._M_parent + 4);
              if (iVar11 == 1) {
                if (p_Var18[5]._M_left == p_Var18[5]._M_parent) {
                  if (p_Var18[4]._M_right == (_Base_ptr)0x0) {
                    bVar10 = false;
                  }
                  else {
                    iVar11 = (**(code **)p_Var18[4]._M_right)();
                    bVar10 = iVar11 == 4;
                  }
                  if ((!bVar10) && ((p_Var18[5]._M_color & _S_black) == _S_red)) goto LAB_0023aff2;
                  (local_3e8->st)._blocked = true;
LAB_0023b17e:
                  local_4a8 = 0;
                  uStack_4a7 = 0;
                  local_4a0 = false;
                  local_4b8._M_allocated_capacity = 0;
                  local_4b8._M_local_buf[8] = '\0';
                  local_4b8._M_local_buf[9] = '\0';
                  local_4b8._M_local_buf[10] = '\0';
                  local_4b8._11_5_ = 0;
                  local_4c0 = (texcoord2f)((ulong)local_4c0 & 0xffffffffffff0000);
                  local_4c8._0_4_ = 0.0;
                  local_4c8._4_4_ = 0.0;
                  local_218.data._0_8_ = (undefined8)&p_Var18[4]._M_parent;
                  local_1b8.data._0_8_ = (undefined8)uVar24;
                  if (p_Var18[5]._M_left == p_Var18[5]._M_parent) {
                    local_460 = (TimeSamples *)((ulong)local_460 & 0xffffffff00000000);
                    local_218._8_8_ = aVar4;
LAB_0023bee4:
                    if (((char)p_Var18[5]._M_color == _S_red) &&
                       (p_Var18[4]._M_right != (_Base_ptr)0x0)) {
                      iVar11 = (**(code **)p_Var18[4]._M_right)();
                      if (iVar11 != 0) {
                        if (p_Var18[4]._M_right != (_Base_ptr)0x0) {
                          iVar11 = (**(code **)p_Var18[4]._M_right)();
                          if (iVar11 == 1) goto LAB_0023bf18;
                        }
                        goto LAB_0023bf1d;
                      }
LAB_0023bf18:
                      bVar5 = false;
                    }
                    else {
LAB_0023bf1d:
                      uVar24 = local_218.data._0_8_;
                      primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                                ((optional<tinyusdz::value::texcoord2f> *)local_3a8,
                                 (PrimVar *)local_218.data._0_8_);
                      if (local_3a8[0] != '\x01') {
                        local_498._0_4_ = 8;
                        local_458._M_dataplus._M_p._0_7_ = 0x54;
                        local_458._M_dataplus._M_p._7_1_ = 0;
                        local_4f8._0_8_ = local_4e8;
                        tVar20 = (texcoord2f)
                                 ::std::__cxx11::string::_M_create
                                           ((ulong *)local_4f8,(ulong)&local_458);
                        tVar16.t._3_1_ = local_458._M_dataplus._M_p._7_1_;
                        tVar16._0_7_ = local_458._M_dataplus._M_p._0_7_;
                        local_4f8._0_8_ = tVar20;
                        local_4e8._0_8_ = tVar16;
                        memcpy((void *)tVar20,
                               "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                               ,0x54);
                        *(char *)((long)tVar16 + (long)tVar20) = '\0';
                        local_458._M_dataplus._M_p._0_7_ = SUB87(&local_458.field_2,0);
                        local_458._M_dataplus._M_p._7_1_ =
                             (undefined1)((ulong)&local_458.field_2 >> 0x38);
                        local_458.field_2._M_local_buf[0] = 't';
                        local_458.field_2._M_allocated_capacity._1_7_ = 0x64726f6f437865;
                        local_458.field_2._8_2_ = 0x6632;
                        local_458._M_string_length._0_7_ = 10;
                        local_458._M_string_length._7_1_ = 0;
                        local_458.field_2._M_local_buf[10] = '\0';
                        local_4f8._8_8_ = tVar16;
                        primvar::PrimVar::type_name_abi_cxx11_(&local_438,(PrimVar *)uVar24);
                        fmt::format<std::__cxx11::string,std::__cxx11::string>
                                  ((string *)local_3a8,(fmt *)local_4f8,&local_458,&local_438,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar26);
                        ::std::__cxx11::string::operator=
                                  ((string *)(local_498 + 8),(string *)local_3a8);
                        if ((undefined1 *)local_3a8._0_8_ != local_398) {
                          operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                        }
                        if (local_438._M_dataplus._M_p != (pointer)((long)&local_438 + 0x10)) {
                          operator_delete(local_438._M_dataplus._M_p,
                                          local_438.field_2._M_allocated_capacity + 1);
                        }
                        paVar15 = &local_458.field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT17(local_458._M_dataplus._M_p._7_1_,
                                        local_458._M_dataplus._M_p._0_7_) != paVar15) {
                          operator_delete((undefined1 *)
                                          CONCAT17(local_458._M_dataplus._M_p._7_1_,
                                                   local_458._M_dataplus._M_p._0_7_),
                                          CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                                                   local_458.field_2._M_local_buf[0]) + 1);
                          paVar15 = extraout_RAX_03;
                        }
                        if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                          paVar15 = extraout_RAX_04;
                        }
                        bVar5 = false;
                        cVar22 = (char)local_460;
                        bVar6 = false;
                        local_460 = (TimeSamples *)
                                    CONCAT44(local_460._4_4_,
                                             (int)CONCAT71((int7)((ulong)paVar15 >> 8),1));
                        goto LAB_0023c0f9;
                      }
                      local_4c8._4_2_ = local_3a8._8_2_;
                      local_4c8._0_4_ = local_3a8._4_4_;
                      local_4c8._6_2_ = local_3a8._10_2_;
                      local_4c0.s._0_2_ = 1;
                      bVar5 = true;
                    }
                    cVar22 = (char)local_460;
                    if (((char)local_460 != '\0') || (bVar5)) {
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::operator=
                                ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *)
                                 local_218._16_8_,
                                 (Animatable<tinyusdz::value::texcoord2f> *)local_4c8);
                    }
                    bVar6 = true;
                    local_460 = (TimeSamples *)((ulong)local_460 & 0xffffffff00000000);
                  }
                  else {
                    local_4e8[0x10] = '\0';
                    local_4e8._17_7_ = 0;
                    local_4d0 = false;
                    local_4e8._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_4e8[8] = '\0';
                    local_4e8[9] = '\0';
                    local_4e8[10] = '\0';
                    local_4e8[0xb] = '\0';
                    local_4e8._12_4_ = 0;
                    local_4f8._8_8_ = local_4f8._8_8_ & 0xffffffffffff0000;
                    local_4f8._0_4_ = 0.0;
                    local_4f8._4_4_ = 0.0;
                    local_218._8_8_ = aVar4;
                    bVar10 = primvar::PrimVar::is_valid((PrimVar *)local_218.data._0_8_);
                    piVar7 = (int *)local_3a8._0_8_;
                    if (bVar10) {
                      if (((char)p_Var18[5]._M_color == _S_red) &&
                         (p_Var18[4]._M_right != (_Base_ptr)0x0)) {
                        iVar11 = (**(code **)p_Var18[4]._M_right)();
                        piVar7 = (int *)local_3a8._0_8_;
                        if (iVar11 != 0) {
                          if (p_Var18[4]._M_right != (_Base_ptr)0x0) {
                            iVar11 = (**(code **)p_Var18[4]._M_right)();
                            piVar7 = (int *)local_3a8._0_8_;
                            if (iVar11 == 1) goto LAB_0023b27c;
                          }
                          goto LAB_0023b21d;
                        }
LAB_0023b27c:
                        pSVar29 = (pointer)p_Var18[5]._M_parent;
                        if ((pointer)p_Var18[5]._M_left == pSVar29) goto LAB_0023bd48;
LAB_0023b290:
                        local_460 = (TimeSamples *)&p_Var18[5]._M_parent;
                        lVar27 = 0;
                        uVar23 = 0;
                        do {
                          pTVar8 = local_460;
                          local_3a8._0_8_ = piVar7;
                          if ((char)p_Var18[6]._M_color == _S_black) {
                            tinyusdz::value::TimeSamples::update(local_460);
                            pSVar29 = (pTVar8->_samples).
                                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          }
                          if ((&pSVar29->blocked)[lVar27] == true) {
                            TypedTimeSamples<tinyusdz::value::texcoord2f>::add_blocked_sample
                                      ((TypedTimeSamples<tinyusdz::value::texcoord2f> *)local_4e8,
                                       *(double *)((long)&pSVar29->t + lVar27));
                            piVar7 = (int *)local_3a8._0_8_;
                          }
                          else {
                            tinyusdz::value::Value::get_value<tinyusdz::value::texcoord2f>
                                      (&local_164,
                                       (Value *)((long)&(pSVar29->value).v_.storage + lVar27),false)
                            ;
                            local_438._M_dataplus._M_p._0_1_ = local_164.has_value_;
                            if (local_164.has_value_ != true) {
                              piVar7 = (int *)local_3a8._0_8_;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_4e8._0_8_ !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                operator_delete((void *)local_4e8._0_8_,
                                                CONCAT71(local_4e8._17_7_,local_4e8[0x10]) -
                                                local_4e8._0_8_);
                                piVar7 = (int *)local_3a8._0_8_;
                              }
                              goto LAB_0023bd48;
                            }
                            local_438._M_dataplus._M_p._4_4_ = local_164.contained._0_4_;
                            local_438._M_string_length._0_4_ = local_164.contained._4_4_;
                            TypedTimeSamples<tinyusdz::value::texcoord2f>::add_sample
                                      ((TypedTimeSamples<tinyusdz::value::texcoord2f> *)local_4e8,
                                       *(double *)((long)&pSVar29->t + lVar27),
                                       (texcoord2f *)((long)&local_438 + 4));
                            piVar7 = (int *)local_3a8._0_8_;
                          }
                          uVar23 = uVar23 + 1;
                          pSVar29 = (pointer)p_Var18[5]._M_parent;
                          lVar27 = lVar27 + 0x28;
                        } while (uVar23 < (ulong)(((long)p_Var18[5]._M_left - (long)pSVar29 >> 3) *
                                                 -0x3333333333333333));
                        local_388 = CONCAT13(local_4e8[0xb],
                                             CONCAT12(local_4e8[10],
                                                      CONCAT11(local_4e8[9],local_4e8[8])));
                        uVar30 = local_4e8._0_4_;
                        local_398._12_4_ = local_4e8._4_4_;
                        uStack_384 = local_4e8._12_4_;
                        local_378 = local_4d0;
                        local_380 = local_4e8[0x10];
                        uStack_37f = local_4e8._17_7_;
                      }
                      else {
LAB_0023b21d:
                        primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                                  ((optional<tinyusdz::value::texcoord2f> *)&local_438,
                                   (PrimVar *)local_218.data._0_8_);
                        piVar7 = (int *)local_3a8._0_8_;
                        if (local_438._M_dataplus._M_p._0_1_ == false) goto LAB_0023b27c;
                        local_4f8._4_4_ = (undefined4)local_438._M_string_length;
                        local_4f8._0_4_ = local_438._M_dataplus._M_p._4_4_;
                        local_4f8._8_2_ = 1;
                        pSVar29 = (pointer)p_Var18[5]._M_parent;
                        if ((pointer)p_Var18[5]._M_left != pSVar29) goto LAB_0023b290;
                        local_388 = Varying;
                        uStack_384._0_1_ = false;
                        uStack_384._1_3_ = 0;
                        local_380 = '\0';
                        uStack_37f = 0;
                        uVar30 = 0;
                        local_398._12_4_ = 0;
                        local_378 = 0;
                      }
                      local_3a8._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
                      local_458._M_string_length._7_1_ = (undefined1)local_4f8._8_8_;
                      local_458.field_2._M_local_buf[0] = SUB81(local_4f8._8_8_,1);
                      local_458._M_dataplus._M_p._7_1_ = (undefined1)local_4f8._0_8_;
                      local_458._M_string_length._0_7_ = SUB87(local_4f8._0_8_,1);
                      local_3a8._1_3_ = (undefined3)((ulong)piVar7 >> 8);
                      local_3a8[0] = 1;
                      local_398._0_2_ = local_4f8._8_2_;
                      local_3a8._8_2_ = (undefined2)local_4f8._0_8_;
                      local_3a8._10_2_ = SUB82(local_4f8._0_8_,2);
                      fStack_39c = SUB84(local_4f8._0_8_,4);
                      local_398[8] = (undefined1)uVar30;
                      local_398[9] = (undefined1)((uint)uVar30 >> 8);
                      local_398[10] = (undefined1)((uint)uVar30 >> 0x10);
                      local_398[0xb] = (undefined1)((uint)uVar30 >> 0x18);
                      local_4c8._0_4_ = local_4f8._0_4_;
                      local_4c8._4_4_ = local_4f8._4_4_;
                      local_4c0.s._0_2_ = local_4f8._8_2_;
                      pvVar14 = ::std::
                                vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                                ::operator=((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                                             *)&local_4b8,
                                            (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                                             *)(local_398 + 8));
                      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71((int7)((ulong)pvVar14 >> 8),local_378);
                      local_4a0 = (bool)local_378;
                      bVar10 = true;
                    }
                    else {
LAB_0023bd48:
                      local_3a8._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
                      local_3a8._0_4_ = SUB84(piVar7,0);
                      local_3a8._0_4_ = local_3a8._0_4_ & 0xffffff00;
                      local_498._0_4_ = 8;
                      local_458._M_dataplus._M_p._0_7_ = SUB87(&local_458.field_2,0);
                      local_458._M_dataplus._M_p._7_1_ =
                           (undefined1)((ulong)&local_458.field_2 >> 0x38);
                      local_438._M_dataplus._M_p._0_1_ = true;
                      local_438._M_dataplus._M_p._1_3_ = 0;
                      local_438._M_dataplus._M_p._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                      pvVar19 = (void *)::std::__cxx11::string::_M_create
                                                  ((ulong *)&local_458,(ulong)&local_438);
                      uVar30 = local_438._M_dataplus._M_p._4_4_;
                      local_458._M_dataplus._M_p._0_7_ = SUB87(pvVar19,0);
                      local_458._M_dataplus._M_p._7_1_ = (undefined1)((ulong)pvVar19 >> 0x38);
                      lVar27 = CONCAT44(local_438._M_dataplus._M_p._4_4_,
                                        local_438._M_dataplus._M_p._0_4_);
                      local_458.field_2._M_local_buf[0] = (char)local_438._M_dataplus._M_p._0_4_;
                      local_458.field_2._M_allocated_capacity._1_7_ =
                           (undefined7)((ulong)lVar27 >> 8);
                      memcpy(pvVar19,
                             "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                             ,0x7b);
                      local_458._M_string_length._0_7_ = (undefined7)lVar27;
                      local_458._M_string_length._7_1_ = SUB41(uVar30,3);
                      *(undefined1 *)((long)pvVar19 + lVar27) = 0;
                      local_438._M_dataplus._M_p = (pointer)((long)&local_438 + 0x10);
                      local_438.field_2._M_allocated_capacity = 0x64726f6f43786574;
                      local_438.field_2._8_2_ = 0x6632;
                      local_438._M_string_length._0_4_ = 10;
                      local_438._M_string_length._4_4_ = 0;
                      local_438.field_2._M_local_buf[10] = '\0';
                      fmt::format<std::__cxx11::string,std::__cxx11::string>
                                ((string *)local_4f8,(fmt *)&local_458,(string *)&local_1d8,
                                 &local_438,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar26);
                      ::std::__cxx11::string::operator=
                                ((string *)(local_498 + 8),(string *)local_4f8);
                      if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                        operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                      }
                      if (local_438._M_dataplus._M_p != (pointer)((long)&local_438 + 0x10)) {
                        operator_delete(local_438._M_dataplus._M_p,
                                        local_438.field_2._M_allocated_capacity + 1);
                      }
                      paVar15 = &local_458.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT17(local_458._M_dataplus._M_p._7_1_,
                                      local_458._M_dataplus._M_p._0_7_) != paVar15) {
                        operator_delete((undefined1 *)
                                        CONCAT17(local_458._M_dataplus._M_p._7_1_,
                                                 local_458._M_dataplus._M_p._0_7_),
                                        CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                                                 local_458.field_2._M_local_buf[0]) + 1);
                        paVar15 = extraout_RAX_01;
                      }
                      bVar10 = false;
                    }
                    if ((local_3a8[0] == '\x01') &&
                       (pvVar19 = (void *)CONCAT44(local_398._12_4_,
                                                   CONCAT13(local_398[0xb],
                                                            CONCAT12(local_398[10],
                                                                     CONCAT11(local_398[9],
                                                                              local_398[8])))),
                       pvVar19 != (void *)0x0)) {
                      operator_delete(pvVar19,CONCAT71(uStack_37f,local_380) - (long)pvVar19);
                      paVar15 = extraout_RAX_02;
                    }
                    local_460 = (TimeSamples *)
                                CONCAT44(local_460._4_4_,
                                         (int)CONCAT71((int7)((ulong)paVar15 >> 8),1));
                    bVar5 = false;
                    cVar22 = '\0';
                    bVar6 = false;
                    if (bVar10) goto LAB_0023bee4;
                  }
LAB_0023c0f9:
                  if ((void *)local_4b8._M_allocated_capacity != (void *)0x0) {
                    operator_delete((void *)local_4b8._M_allocated_capacity,
                                    CONCAT71(uStack_4a7,local_4a8) - local_4b8._0_8_);
                  }
                  uVar24 = local_1b8.data._0_8_;
                  if (bVar6) goto LAB_0023c11d;
                }
                else {
LAB_0023aff2:
                  if (p_Var18[3]._M_color != _S_black) goto LAB_0023b17e;
                  bVar10 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var18[4]._M_parent);
                  if (bVar10) {
                    local_498._0_4_ = 4;
                    local_4c8._0_4_ = 7.56701e-44;
                    local_4c8._4_4_ = 0.0;
                    local_4f8._0_8_ = local_4e8;
                    local_4f8._0_8_ =
                         ::std::__cxx11::string::_M_create((ulong *)local_4f8,(ulong)local_4c8);
                    local_4e8._0_8_ = local_4c8;
                    *(undefined8 *)local_4f8._0_8_ = 0x706d6153656d6954;
                    *(undefined8 *)(local_4f8._0_8_ + 8) = 0x65756c617620656c;
                    *(undefined8 *)(local_4f8._0_8_ + 0x10) = 0x6973736120736920;
                    *(undefined8 *)(local_4f8._0_8_ + 0x18) = 0x206f742064656e67;
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_4f8._0_8_ + 0x20))->_M_allocated_capacity = 0x6d726f66696e7560;
                    *(undefined8 *)(local_4f8._0_8_ + 0x28) = 0x7265706f72702060;
                    builtin_strncpy((char *)(local_4f8._0_8_ + 0x2e),"erty `{}",8);
                    local_4f8._8_8_ = local_4c8;
                    *(char *)(local_4f8._0_8_ + (long)local_4c8) = '\0';
                    fmt::format<std::__cxx11::string>
                              ((string *)local_3a8,(fmt *)local_4f8,&local_3c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8);
                    ::std::__cxx11::string::operator=((string *)(local_498 + 8),(string *)local_3a8)
                    ;
                    if ((undefined1 *)local_3a8._0_8_ != local_398) {
                      operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                    }
                    if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                      operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                    }
                    goto LAB_00239775;
                  }
                  primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                            ((optional<tinyusdz::value::texcoord2f> *)local_3a8,
                             (PrimVar *)&p_Var18[4]._M_parent);
                  if (local_3a8[0] == '\x01') {
                    local_388 = Varying;
                    uStack_384._0_1_ = false;
                    uStack_384._1_3_ = 0;
                    local_380 = '\0';
                    local_398._0_8_ = (code *)0x0;
                    local_398[8] = '\0';
                    local_398[9] = '\0';
                    local_398[10] = '\0';
                    local_398[0xb] = '\0';
                    local_398._12_4_ = 0;
                    local_3a8._0_4_ = local_3a8._4_4_;
                    local_3a8._4_4_ =
                         (undefined4)
                         (CONCAT26(local_3a8._10_2_,CONCAT24(local_3a8._8_2_,local_3a8._4_4_)) >>
                         0x20);
                    local_3a8._8_2_ = 1;
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::operator=
                              ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *)
                               local_218._16_8_,(Animatable<tinyusdz::value::texcoord2f> *)local_3a8
                              );
                    if ((code *)local_398._0_8_ != (code *)0x0) {
                      operator_delete((void *)local_398._0_8_,
                                      CONCAT44(uStack_384,local_388) - local_398._0_8_);
                    }
                    goto LAB_0023b17e;
                  }
                  local_498._0_4_ = 3;
                  local_4f8._0_8_ = local_4e8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_4f8,
                             "Fallback. Failed to retrieve value with requested type `{}`.","");
                  local_4c8 = (undefined1  [8])&local_4b8;
                  local_4b8._M_allocated_capacity = 0x64726f6f43786574;
                  local_4b8._M_local_buf[8] = '2';
                  local_4b8._M_local_buf[9] = 'f';
                  local_4c0.s = 1.4013e-44;
                  local_4c0.t = 0.0;
                  local_4b8._M_local_buf[10] = '\0';
                  fmt::format<std::__cxx11::string>
                            ((string *)local_3a8,(fmt *)local_4f8,(string *)local_4c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x64726f6f43786574);
                  ::std::__cxx11::string::operator=((string *)(local_498 + 8),(string *)local_3a8);
                  if ((undefined1 *)local_3a8._0_8_ != local_398) {
                    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                  }
                  tVar16 = (texcoord2f)&local_4b8;
                  if ((texcoord2f)local_4c8 != tVar16) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    tVar16 = extraout_RAX;
                  }
                  if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                    operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                    tVar16 = extraout_RAX_00;
                  }
                  local_460 = (TimeSamples *)CONCAT44(local_460._4_4_,(int)CONCAT71(tVar16._1_7_,1))
                  ;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ != &local_1e8) {
                  operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
                }
                if (((char)local_460 == '\0') && (local_490 != (texcoord2f)((long)local_498 + 0x18))
                   ) {
                  uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)CONCAT71(local_488._9_7_,local_488._M_local_buf[8]);
                  tVar16 = local_490;
                  goto LAB_00239792;
                }
                goto LAB_0023979a;
              }
              if (iVar11 == 0) {
                (local_3e8->st)._empty = true;
                AttrMetas::operator=((AttrMetas *)local_218._24_8_,(AttrMetas *)(p_Var18 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_418,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3c8);
                local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
              }
              else {
                bVar5 = false;
                cVar22 = '\0';
                local_218._8_8_ = aVar4;
LAB_0023c11d:
                if (local_218._8_8_ == uVar24) {
                  if ((cVar22 == '\0') && (!bVar5)) {
                    pPVar26 = (Property *)0x25;
                    ::std::__cxx11::string::_M_replace
                              ((ulong)(local_498 + 8),0,(char *)local_488._M_allocated_capacity,
                               0x3dc8ba);
                    local_498._0_4_ = 8;
                    goto LAB_00239775;
                  }
                }
                else if ((cVar22 == '\0') && (!bVar5)) {
                  (local_3e8->st)._empty = true;
                }
                AttrMetas::operator=((AttrMetas *)local_218._24_8_,(AttrMetas *)(p_Var18 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_418,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3c8);
                local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
              }
            }
            else {
              local_4f8._8_4_ = 8.40779e-45;
              local_4f8._12_4_ = 0.0;
              local_4e8._0_7_ = 0x3274616f6c66;
              local_4f8._0_8_ = local_4e8;
              if (((anon_struct_8_0_00000001_for___align)local_1f8._8_8_ ==
                   (anon_struct_8_0_00000001_for___align)0x6) &&
                 (*(short *)(local_1f8._0_8_ + 4) == 0x3274 && *(int *)local_1f8._0_8_ == 0x616f6c66
                 )) goto LAB_0023a45e;
LAB_00239629:
              local_498._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_3a8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_398,"Property type mismatch. ",0x18);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_398,local_3c8._M_dataplus._M_p,
                                   local_3c8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," expects type `",0xf);
              local_4f8._0_8_ = local_4e8;
              local_4e8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x64726f6f43786574;
              local_4e8[8] = '2';
              local_4e8[9] = 'f';
              local_4f8._8_4_ = 1.4013e-44;
              local_4f8._12_4_ = 0.0;
              local_4e8[10] = '\0';
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_4e8,10);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"` but defined as type `",0x17);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_1f8._0_8_,local_1f8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"`",1);
              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)(local_498 + 8),(string *)local_4f8);
              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_3a8);
              ::std::ios_base::~ios_base(local_328);
            }
LAB_00239775:
            uVar24 = local_1e8._M_allocated_capacity;
            tVar16 = (texcoord2f)local_1f8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._0_8_ != &local_1e8) goto LAB_00239792;
          }
        }
LAB_0023979a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_allocated_capacity != &local_1c8) {
          operator_delete((void *)local_1d8._M_allocated_capacity,
                          local_1c8._M_allocated_capacity + 1);
        }
        iVar11 = 0;
        if (((ulong)local_498 & 0xfffffffd) == 0) {
          iVar11 = 3;
LAB_00239a06:
          bVar10 = false;
        }
        else {
          bVar10 = true;
          if (local_498._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xfef);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_4c8 = (undefined1  [8])&local_4b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4c8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[10],std::__cxx11::string>
                      ((string *)local_4f8,(fmt *)local_4c8,(string *)"inputs:st",
                       (char (*) [10])(local_498 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar26)
            ;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,(char *)local_4f8._0_8_,local_4f8._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
              operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
            }
            pTVar28 = local_470;
            if (local_4c8 != (undefined1  [8])&local_4b8) {
              operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
            }
            if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ptVar13 = (texcoord2f *)
                        ::std::__cxx11::string::_M_append
                                  (local_4c8,(ulong)(pTVar28->_metas).interpolation);
              tVar16 = (texcoord2f)(ptVar13 + 2);
              if (*ptVar13 == tVar16) {
                local_4e8._0_8_ = *(undefined8 *)tVar16;
                tVar20 = ptVar13[3];
                local_4e8[8] = tVar20.s._0_1_;
                local_4e8[9] = tVar20.s._1_1_;
                local_4e8[10] = tVar20.s._2_1_;
                local_4e8[0xb] = tVar20.s._3_1_;
                local_4e8._12_4_ = tVar20.t;
                local_4f8._0_8_ = local_4e8;
              }
              else {
                local_4e8._0_8_ = *(undefined8 *)tVar16;
                local_4f8._0_8_ = *ptVar13;
              }
              local_4f8._8_8_ = ptVar13[1];
              *ptVar13 = tVar16;
              ptVar13[1].s = 0.0;
              ptVar13[1].t = 0.0;
              *(undefined1 *)&ptVar13[2].s = 0;
              ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4f8);
              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
              }
              if (local_4c8 != (undefined1  [8])&local_4b8) {
                operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
            ::std::ios_base::~ios_base(local_338);
            iVar11 = 1;
            goto LAB_00239a06;
          }
        }
        if (local_490 != (texcoord2f)((long)local_498 + 0x18)) {
          operator_delete((void *)local_490,CONCAT71(local_488._9_7_,local_488._M_local_buf[8]) + 1)
          ;
        }
        if (!bVar10) goto LAB_0023bcfc;
        __k = p_Var18 + 1;
        iVar11 = ::std::__cxx11::string::compare((char *)__k);
        if (iVar11 == 0) {
          local_3a8._0_8_ = local_398;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3a8,"inputs:sourceColorSpace","");
          cVar17 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_418,(key_type *)local_3a8);
          if ((undefined1 *)local_3a8._0_8_ != local_398) {
            operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
          }
          if ((_Rb_tree_header *)cVar17._M_node == &local_418._M_impl.super__Rb_tree_header) {
            pTVar28 = local_470;
            if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
              Attribute::type_name_abi_cxx11_((string *)local_3a8,(Attribute *)prop);
              pTVar28 = local_470;
              local_4f8._0_8_ = local_4e8;
              local_4f8._8_4_ = 7.00649e-45;
              local_4f8._12_4_ = 0.0;
              local_4e8._0_6_ = 0x6e656b6f74;
              if (((CONCAT44(fStack_39c,CONCAT22(local_3a8._10_2_,local_3a8._8_2_)) == 5) &&
                  ((char)*(int *)(local_3a8._0_8_ + 4) == 'n' &&
                   *(int *)local_3a8._0_8_ == 0x656b6f74)) &&
                 (uVar3 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4), uVar3 < 2)) {
                if ((undefined1 *)local_3a8._0_8_ != local_398) {
                  operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                }
                if (uVar3 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xff2);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"inputs:sourceColorSpace",0x17);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"\n",1);
                  if (local_468 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ptVar13 = (texcoord2f *)
                              ::std::__cxx11::string::_M_append
                                        (local_4c8,(ulong)(pTVar28->_metas).interpolation);
                    tVar16 = (texcoord2f)(ptVar13 + 2);
                    if (*ptVar13 == tVar16) {
                      local_4e8._0_8_ = *(undefined8 *)tVar16;
                      tVar20 = ptVar13[3];
                      local_4e8[8] = tVar20.s._0_1_;
                      local_4e8[9] = tVar20.s._1_1_;
                      local_4e8[10] = tVar20.s._2_1_;
                      local_4e8[0xb] = tVar20.s._3_1_;
                      local_4e8._12_4_ = tVar20.t;
                      local_4f8._0_8_ = local_4e8;
                    }
                    else {
                      local_4e8._0_8_ = *(undefined8 *)tVar16;
                      local_4f8._0_8_ = *ptVar13;
                    }
                    local_4f8._8_8_ = ptVar13[1];
                    *ptVar13 = tVar16;
                    ptVar13[1].s = 0.0;
                    ptVar13[1].t = 0.0;
                    *(undefined1 *)&ptVar13[2].s = 0;
                    ::std::__cxx11::string::operator=((string *)local_468,(string *)local_4f8);
                    if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                      operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                    }
                    if (local_4c8 != (undefined1  [8])&local_4b8) {
                      operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                  ::std::ios_base::~ios_base(local_338);
                  AttrMetas::operator=(&local_3d0->_metas,(AttrMetas *)(p_Var18 + 7));
                  pcVar25 = "inputs:sourceColorSpace";
                  pcVar21 = "";
LAB_0023c37f:
                  local_3a8._0_8_ = local_398;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3a8,pcVar25,pcVar21);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_418,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8);
                  if ((undefined1 *)local_3a8._0_8_ != local_398) {
                    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                  }
                  goto LAB_0023bd0b;
                }
              }
              else if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                pTVar28 = local_470;
              }
            }
            local_3a8._0_4_ = 0;
            local_3a8._4_4_ = 0;
            local_3a8._8_2_ = 0;
            local_3a8._10_2_ = 0;
            fStack_39c = 0.0;
            local_398[8] = '\x1a';
            local_398[9] = -0x16;
            local_398[10] = '%';
            local_398[0xb] = '\0';
            local_398._12_4_ = 0;
            local_398._0_8_ =
                 ::std::
                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4044:34)>
                 ::_M_manager;
            local_4f8._0_8_ = local_4e8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4f8,"inputs:sourceColorSpace","");
            bVar10 = options->strict_allowedToken_check;
            local_48 = (code *)0x0;
            aStack_40._M_allocated_capacity = 0;
            auStack_60._8_8_ = 0;
            _Stack_50._M_p = (pointer)0x0;
            p_Var1 = (_Any_data *)(auStack_60 + 8);
            if ((code *)local_398._0_8_ != (code *)0x0) {
              (*(code *)local_398._0_8_)(p_Var1,(Property *)local_3a8,2);
              aStack_40._M_allocated_capacity =
                   CONCAT44(local_398._12_4_,
                            CONCAT13(local_398[0xb],
                                     CONCAT12(local_398[10],CONCAT11(local_398[9],local_398[8]))));
              local_48 = (code *)local_398._0_8_;
            }
            bVar10 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::SourceColorSpace,tinyusdz::UsdUVTexture::SourceColorSpace>
                               ((string *)local_4f8,bVar10,
                                (EnumHandlerFun<tinyusdz::UsdUVTexture::SourceColorSpace> *)p_Var1,
                                (Attribute *)prop,local_3d0,local_468,(string *)pTVar28);
            in_stack_fffffffffffffaf8 = pTVar28;
            if (local_48 != (code *)0x0) {
              (*local_48)(p_Var1,p_Var1,__destroy_functor);
              in_stack_fffffffffffffaf8 = pTVar28;
            }
            if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
              operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
            }
            iVar11 = 1;
            if (bVar10) {
              AttrMetas::operator=(&local_3d0->_metas,(AttrMetas *)(p_Var18 + 7));
              pcVar25 = "inputs:sourceColorSpace";
              pcVar21 = "";
LAB_0023a94e:
              local_4f8._0_8_ = local_4e8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,pcVar25,pcVar21)
              ;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_418,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f8);
              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
              }
              iVar11 = 3;
            }
LAB_0023a980:
            if ((code *)local_398._0_8_ != (code *)0x0) {
              (*(code *)local_398._0_8_)((Property *)local_3a8,(Property *)local_3a8,3);
            }
            goto LAB_0023bcfc;
          }
        }
        else {
          iVar11 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar11 == 0) {
            local_3a8._0_8_ = local_398;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"inputs:wrapS","")
            ;
            cVar17 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_418,(key_type *)local_3a8);
            if ((undefined1 *)local_3a8._0_8_ != local_398) {
              operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
            }
            if ((_Rb_tree_header *)cVar17._M_node == &local_418._M_impl.super__Rb_tree_header) {
              pTVar28 = local_470;
              if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_3a8,(Attribute *)prop);
                pTVar28 = local_470;
                local_4f8._0_8_ = local_4e8;
                local_4f8._8_4_ = 7.00649e-45;
                local_4f8._12_4_ = 0.0;
                local_4e8._0_6_ = 0x6e656b6f74;
                if (((CONCAT44(fStack_39c,CONCAT22(local_3a8._10_2_,local_3a8._8_2_)) == 5) &&
                    ((char)*(int *)(local_3a8._0_8_ + 4) == 'n' &&
                     *(int *)local_3a8._0_8_ == 0x656b6f74)) &&
                   (uVar3 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4), uVar3 < 2)) {
                  if ((undefined1 *)local_3a8._0_8_ != local_398) {
                    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                  }
                  if (uVar3 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"():",3);
                    poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xff5);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"inputs:wrapS",0xc);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3a8,"\n",1);
                    if (local_468 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ptVar13 = (texcoord2f *)
                                ::std::__cxx11::string::_M_append
                                          (local_4c8,(ulong)(pTVar28->_metas).interpolation);
                      tVar16 = (texcoord2f)(ptVar13 + 2);
                      if (*ptVar13 == tVar16) {
                        local_4e8._0_8_ = *(undefined8 *)tVar16;
                        tVar20 = ptVar13[3];
                        local_4e8[8] = tVar20.s._0_1_;
                        local_4e8[9] = tVar20.s._1_1_;
                        local_4e8[10] = tVar20.s._2_1_;
                        local_4e8[0xb] = tVar20.s._3_1_;
                        local_4e8._12_4_ = tVar20.t;
                        local_4f8._0_8_ = local_4e8;
                      }
                      else {
                        local_4e8._0_8_ = *(undefined8 *)tVar16;
                        local_4f8._0_8_ = *ptVar13;
                      }
                      local_4f8._8_8_ = ptVar13[1];
                      *ptVar13 = tVar16;
                      ptVar13[1].s = 0.0;
                      ptVar13[1].t = 0.0;
                      *(undefined1 *)&ptVar13[2].s = 0;
                      ::std::__cxx11::string::operator=((string *)local_468,(string *)local_4f8);
                      if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                        operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                      }
                      if (local_4c8 != (undefined1  [8])&local_4b8) {
                        operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                    ::std::ios_base::~ios_base(local_338);
                    AttrMetas::operator=(&local_3d8->_metas,(AttrMetas *)(p_Var18 + 7));
                    pcVar25 = "inputs:wrapS";
                    pcVar21 = "";
                    goto LAB_0023c37f;
                  }
                }
                else if ((undefined1 *)local_3a8._0_8_ != local_398) {
                  operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                  pTVar28 = local_470;
                }
              }
              local_3a8._0_4_ = 0;
              local_3a8._4_4_ = 0;
              local_3a8._8_2_ = 0;
              local_3a8._10_2_ = 0;
              fStack_39c = 0.0;
              local_398[8] = '|';
              local_398[9] = -0xc;
              local_398[10] = '%';
              local_398[0xb] = '\0';
              local_398._12_4_ = 0;
              local_398._0_8_ =
                   ::std::
                   _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4057:22)>
                   ::_M_manager;
              local_4f8._0_8_ = local_4e8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f8,"inputs:wrapS","");
              bVar10 = options->strict_allowedToken_check;
              local_68 = (code *)0x0;
              auStack_60._0_8_ = 0;
              auStack_80._8_8_ = 0;
              _Stack_70._M_p = (pointer)0x0;
              p_Var1 = (_Any_data *)(auStack_80 + 8);
              if ((code *)local_398._0_8_ != (code *)0x0) {
                (*(code *)local_398._0_8_)(p_Var1,(Property *)local_3a8,2);
                auStack_60._0_8_ =
                     CONCAT44(local_398._12_4_,
                              CONCAT13(local_398[0xb],
                                       CONCAT12(local_398[10],CONCAT11(local_398[9],local_398[8]))))
                ;
                local_68 = (code *)local_398._0_8_;
              }
              bVar10 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                                 ((string *)local_4f8,bVar10,
                                  (EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *)p_Var1,
                                  (Attribute *)prop,local_3d8,local_468,(string *)pTVar28);
              in_stack_fffffffffffffaf8 = pTVar28;
              if (local_68 != (code *)0x0) {
                (*local_68)(p_Var1,p_Var1,__destroy_functor);
                in_stack_fffffffffffffaf8 = pTVar28;
              }
              if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
              }
              iVar11 = 1;
              if (!bVar10) goto LAB_0023a980;
              AttrMetas::operator=(&local_3d8->_metas,(AttrMetas *)(p_Var18 + 7));
              pcVar25 = "inputs:wrapS";
              pcVar21 = "";
              goto LAB_0023a94e;
            }
          }
          else {
            iVar11 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar11 == 0) {
              local_3a8._0_8_ = local_398;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3a8,"inputs:wrapT","");
              cVar17 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_418,(key_type *)local_3a8);
              if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
              }
              if ((_Rb_tree_header *)cVar17._M_node == &local_418._M_impl.super__Rb_tree_header) {
                pTVar28 = local_470;
                if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_3a8,(Attribute *)prop);
                  pTVar28 = local_470;
                  local_4f8._0_8_ = local_4e8;
                  local_4f8._8_4_ = 7.00649e-45;
                  local_4f8._12_4_ = 0.0;
                  local_4e8._0_6_ = 0x6e656b6f74;
                  if (((CONCAT44(fStack_39c,CONCAT22(local_3a8._10_2_,local_3a8._8_2_)) == 5) &&
                      ((char)*(int *)(local_3a8._0_8_ + 4) == 'n' &&
                       *(int *)local_3a8._0_8_ == 0x656b6f74)) &&
                     (uVar3 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4), uVar3 < 2)) {
                    if ((undefined1 *)local_3a8._0_8_ != local_398) {
                      operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                    }
                    if (uVar3 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"ReconstructShader",0x11);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"():",3);
                      poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xff8);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"inputs:wrapT",0xc);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3a8,"\n",1);
                      if (local_468 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_4f8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_4c8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pTVar28);
                        ::std::__cxx11::string::operator=((string *)local_468,(string *)local_4f8);
                        if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                        }
                        if (local_4c8 != (undefined1  [8])&local_4b8) {
                          operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                      ::std::ios_base::~ios_base(local_338);
                      AttrMetas::operator=(&local_3e0->_metas,(AttrMetas *)(p_Var18 + 7));
                      pcVar25 = "inputs:wrapT";
                      pcVar21 = "";
                      goto LAB_0023c37f;
                    }
                  }
                  else if ((undefined1 *)local_3a8._0_8_ != local_398) {
                    operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
                    pTVar28 = local_470;
                  }
                }
                local_3a8._0_4_ = 0;
                local_3a8._4_4_ = 0;
                local_3a8._8_2_ = 0;
                local_3a8._10_2_ = 0;
                fStack_39c = 0.0;
                local_398[8] = '|';
                local_398[9] = -0xc;
                local_398[10] = '%';
                local_398[0xb] = '\0';
                local_398._12_4_ = 0;
                local_398._0_8_ =
                     ::std::
                     _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4057:22)>
                     ::_M_manager;
                local_4f8._0_8_ = local_4e8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4f8,"inputs:wrapT","");
                bVar10 = options->strict_allowedToken_check;
                local_88 = (code *)0x0;
                auStack_80._0_8_ = 0;
                local_98._M_unused._M_object = (void *)0x0;
                local_98._8_8_ = (pointer)0x0;
                if ((code *)local_398._0_8_ != (code *)0x0) {
                  (*(code *)local_398._0_8_)(&local_98,(Property *)local_3a8,2);
                  auStack_80._0_8_ =
                       CONCAT44(local_398._12_4_,
                                CONCAT13(local_398[0xb],
                                         CONCAT12(local_398[10],CONCAT11(local_398[9],local_398[8]))
                                        ));
                  local_88 = (code *)local_398._0_8_;
                }
                bVar10 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                                   ((string *)local_4f8,bVar10,
                                    (EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *)&local_98,
                                    (Attribute *)prop,local_3e0,local_468,(string *)pTVar28);
                in_stack_fffffffffffffaf8 = pTVar28;
                if (local_88 != (code *)0x0) {
                  (*local_88)(&local_98,&local_98,__destroy_functor);
                  in_stack_fffffffffffffaf8 = pTVar28;
                }
                if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                  operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                }
                iVar11 = 1;
                if (bVar10) {
                  AttrMetas::operator=(&local_3e0->_metas,(AttrMetas *)(p_Var18 + 7));
                  pcVar25 = "inputs:wrapT";
                  pcVar21 = "";
                  goto LAB_0023a94e;
                }
                goto LAB_0023a980;
              }
            }
            else {
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,*(long *)(p_Var18 + 1),
                         (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
              local_3a8._0_8_ = local_398;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"outputs:r","");
              pPVar26 = (Property *)local_3a8;
              anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                        ((ParseResult *)local_4f8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_418,&local_d8,prop,(string *)local_3a8,
                         (TypedTerminalAttribute<float> *)local_190._16_8_);
              if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              iVar11 = 0;
              if ((local_4f8._0_8_ & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0023aa2b:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if ((float)local_4f8._0_4_ != 1.4013e-45) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xffa);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  local_498 = (undefined1  [8])(local_498 + 0x10);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_498,
                             "Parsing shader output property `{}` failed. Error: {}","");
                  fmt::format<char[10],std::__cxx11::string>
                            ((string *)local_4c8,(fmt *)local_498,(string *)"outputs:r",
                             (char (*) [10])(local_4f8 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar26);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3a8,(char *)local_4c8,(long)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if (local_4c8 != (undefined1  [8])&local_4b8) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                  }
                  pTVar28 = local_470;
                  if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                    operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
                  }
                  if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ptVar13 = (texcoord2f *)
                              ::std::__cxx11::string::_M_append
                                        (local_498,(ulong)(pTVar28->_metas).interpolation);
                    tVar16 = (texcoord2f)(ptVar13 + 2);
                    if (*ptVar13 == tVar16) {
                      local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
                      tVar20 = ptVar13[3];
                      local_4b8._M_local_buf[8] = tVar20.s._0_1_;
                      local_4b8._M_local_buf[9] = tVar20.s._1_1_;
                      local_4b8._M_local_buf[10] = tVar20.s._2_1_;
                      local_4b8._11_5_ = tVar20._3_5_;
                      local_4c8 = (undefined1  [8])&local_4b8;
                    }
                    else {
                      local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
                      local_4c8 = (undefined1  [8])*ptVar13;
                    }
                    local_4c0 = ptVar13[1];
                    *ptVar13 = tVar16;
                    ptVar13[1].s = 0.0;
                    ptVar13[1].t = 0.0;
                    *(undefined1 *)&ptVar13[2].s = 0;
                    ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4c8);
                    if (local_4c8 != (undefined1  [8])&local_4b8) {
                      operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    }
                    if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                      operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                  ::std::ios_base::~ios_base(local_338);
                  iVar11 = 1;
                  goto LAB_0023aa2b;
                }
              }
              if (local_4f8._8_8_ != (long)local_4e8 + 8) {
                operator_delete((void *)local_4f8._8_8_,
                                CONCAT44(local_4e8._12_4_,
                                         CONCAT13(local_4e8[0xb],
                                                  CONCAT12(local_4e8[10],
                                                           CONCAT11(local_4e8[9],local_4e8[8])))) +
                                1);
              }
              if (!bVar10) goto LAB_0023bcfc;
              local_f8._M_allocated_capacity = (size_type)&local_e8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f8,*(long *)(p_Var18 + 1),
                         (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
              local_3a8._0_8_ = local_398;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"outputs:g","");
              pPVar26 = (Property *)local_3a8;
              anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                        ((ParseResult *)local_4f8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_418,(string *)&local_f8,prop,(string *)local_3a8,
                         (TypedTerminalAttribute<float> *)local_190._8_8_);
              if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_allocated_capacity != &local_e8) {
                operator_delete((void *)local_f8._M_allocated_capacity,
                                local_e8._M_allocated_capacity + 1);
              }
              iVar11 = 0;
              if ((local_4f8._0_8_ & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0023ad43:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if ((float)local_4f8._0_4_ != 1.4013e-45) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xffc);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  local_498 = (undefined1  [8])(local_498 + 0x10);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_498,
                             "Parsing shader output property `{}` failed. Error: {}","");
                  fmt::format<char[10],std::__cxx11::string>
                            ((string *)local_4c8,(fmt *)local_498,(string *)"outputs:g",
                             (char (*) [10])(local_4f8 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar26);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3a8,(char *)local_4c8,(long)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if (local_4c8 != (undefined1  [8])&local_4b8) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                  }
                  pTVar28 = local_470;
                  if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                    operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
                  }
                  if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ptVar13 = (texcoord2f *)
                              ::std::__cxx11::string::_M_append
                                        (local_498,(ulong)(pTVar28->_metas).interpolation);
                    tVar16 = (texcoord2f)(ptVar13 + 2);
                    if (*ptVar13 == tVar16) {
                      local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
                      tVar20 = ptVar13[3];
                      local_4b8._M_local_buf[8] = tVar20.s._0_1_;
                      local_4b8._M_local_buf[9] = tVar20.s._1_1_;
                      local_4b8._M_local_buf[10] = tVar20.s._2_1_;
                      local_4b8._11_5_ = tVar20._3_5_;
                      local_4c8 = (undefined1  [8])&local_4b8;
                    }
                    else {
                      local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
                      local_4c8 = (undefined1  [8])*ptVar13;
                    }
                    local_4c0 = ptVar13[1];
                    *ptVar13 = tVar16;
                    ptVar13[1].s = 0.0;
                    ptVar13[1].t = 0.0;
                    *(undefined1 *)&ptVar13[2].s = 0;
                    ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4c8);
                    if (local_4c8 != (undefined1  [8])&local_4b8) {
                      operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    }
                    if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                      operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                  ::std::ios_base::~ios_base(local_338);
                  iVar11 = 1;
                  goto LAB_0023ad43;
                }
              }
              if (local_4f8._8_8_ != (long)local_4e8 + 8) {
                operator_delete((void *)local_4f8._8_8_,
                                CONCAT44(local_4e8._12_4_,
                                         CONCAT13(local_4e8[0xb],
                                                  CONCAT12(local_4e8[10],
                                                           CONCAT11(local_4e8[9],local_4e8[8])))) +
                                1);
              }
              if (!bVar10) goto LAB_0023bcfc;
              local_118._0_8_ = local_118 + 0x10;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_118,*(long *)(p_Var18 + 1),
                         (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
              local_3a8._0_8_ = local_398;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"outputs:b","");
              pPVar26 = (Property *)local_3a8;
              anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                        ((ParseResult *)local_4f8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_418,(string *)local_118,prop,(string *)local_3a8,local_198);
              if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
              }
              if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
              }
              iVar11 = 0;
              if ((local_4f8._0_8_ & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0023b559:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if ((float)local_4f8._0_4_ != 1.4013e-45) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0xffe);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  local_498 = (undefined1  [8])(local_498 + 0x10);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_498,
                             "Parsing shader output property `{}` failed. Error: {}","");
                  fmt::format<char[10],std::__cxx11::string>
                            ((string *)local_4c8,(fmt *)local_498,(string *)"outputs:b",
                             (char (*) [10])(local_4f8 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar26);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3a8,(char *)local_4c8,(long)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if (local_4c8 != (undefined1  [8])&local_4b8) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                  }
                  pTVar28 = local_470;
                  if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                    operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
                  }
                  if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ptVar13 = (texcoord2f *)
                              ::std::__cxx11::string::_M_append
                                        (local_498,(ulong)(pTVar28->_metas).interpolation);
                    tVar16 = (texcoord2f)(ptVar13 + 2);
                    if (*ptVar13 == tVar16) {
                      local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
                      tVar20 = ptVar13[3];
                      local_4b8._M_local_buf[8] = tVar20.s._0_1_;
                      local_4b8._M_local_buf[9] = tVar20.s._1_1_;
                      local_4b8._M_local_buf[10] = tVar20.s._2_1_;
                      local_4b8._11_5_ = tVar20._3_5_;
                      local_4c8 = (undefined1  [8])&local_4b8;
                    }
                    else {
                      local_4b8._M_allocated_capacity = *(undefined8 *)tVar16;
                      local_4c8 = (undefined1  [8])*ptVar13;
                    }
                    local_4c0 = ptVar13[1];
                    *ptVar13 = tVar16;
                    ptVar13[1].s = 0.0;
                    ptVar13[1].t = 0.0;
                    *(undefined1 *)&ptVar13[2].s = 0;
                    ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4c8);
                    if (local_4c8 != (undefined1  [8])&local_4b8) {
                      operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    }
                    if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                      operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                  ::std::ios_base::~ios_base(local_338);
                  iVar11 = 1;
                  goto LAB_0023b559;
                }
              }
              if (local_4f8._8_8_ != (long)local_4e8 + 8) {
                operator_delete((void *)local_4f8._8_8_,
                                CONCAT44(local_4e8._12_4_,
                                         CONCAT13(local_4e8[0xb],
                                                  CONCAT12(local_4e8[10],
                                                           CONCAT11(local_4e8[9],local_4e8[8])))) +
                                1);
              }
              if (!bVar10) goto LAB_0023bcfc;
              local_138._0_8_ = local_138 + 0x10;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_138,*(long *)(p_Var18 + 1),
                         (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
              local_3a8._0_8_ = local_398;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"outputs:a","");
              pPVar26 = (Property *)local_3a8;
              anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                        ((ParseResult *)local_4f8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_418,(string *)local_138,prop,(string *)local_3a8,
                         (TypedTerminalAttribute<float> *)local_1b8._24_8_);
              if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
              }
              if ((_Base_ptr)local_138._0_8_ != (_Base_ptr)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
              }
              iVar11 = 0;
              if ((local_4f8._0_8_ & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0023b82b:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if ((float)local_4f8._0_4_ != 1.4013e-45) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0x1000);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  local_498 = (undefined1  [8])(local_498 + 0x10);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_498,
                             "Parsing shader output property `{}` failed. Error: {}","");
                  fmt::format<char[10],std::__cxx11::string>
                            ((string *)local_4c8,(fmt *)local_498,(string *)"outputs:a",
                             (char (*) [10])(local_4f8 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar26);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3a8,(char *)local_4c8,(long)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if (local_4c8 != (undefined1  [8])&local_4b8) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                  }
                  pTVar28 = local_470;
                  if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                    operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
                  }
                  if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4c8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_498,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pTVar28);
                    ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4c8);
                    if (local_4c8 != (undefined1  [8])&local_4b8) {
                      operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    }
                    if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                      operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                  ::std::ios_base::~ios_base(local_338);
                  iVar11 = 1;
                  goto LAB_0023b82b;
                }
              }
              if (local_4f8._8_8_ != (long)local_4e8 + 8) {
                operator_delete((void *)local_4f8._8_8_,
                                CONCAT44(local_4e8._12_4_,
                                         CONCAT13(local_4e8[0xb],
                                                  CONCAT12(local_4e8[10],
                                                           CONCAT11(local_4e8[9],local_4e8[8])))) +
                                1);
              }
              if (!bVar10) goto LAB_0023bcfc;
              local_158._0_8_ = local_148;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_158,*(long *)(p_Var18 + 1),
                         (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
              local_3a8._0_8_ = local_398;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3a8,"outputs:rgb","");
              pPVar26 = (Property *)local_3a8;
              (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                        ((ParseResult *)local_4f8,(_anonymous_namespace_ *)&local_418,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_158,(string *)prop,(Property *)local_3a8,
                         (string *)local_1b8._16_8_,in_stack_fffffffffffffaf8);
              if ((undefined1 *)local_3a8._0_8_ != local_398) {
                operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
              }
              if ((long *)local_158._0_8_ != local_148) {
                operator_delete((void *)local_158._0_8_,local_148[0] + 1);
              }
              iVar11 = 0;
              if ((local_4f8._0_8_ & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0023bafd:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if ((float)local_4f8._0_4_ != 1.4013e-45) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3a8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0x1002);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  local_498 = (undefined1  [8])(local_498 + 0x10);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_498,
                             "Parsing shader output property `{}` failed. Error: {}","");
                  fmt::format<char[12],std::__cxx11::string>
                            ((string *)local_4c8,(fmt *)local_498,(string *)"outputs:rgb",
                             (char (*) [12])(local_4f8 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar26);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3a8,(char *)local_4c8,(long)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if (local_4c8 != (undefined1  [8])&local_4b8) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                  }
                  pTVar28 = local_470;
                  if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                    operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
                  }
                  if (pTVar28 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4c8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_498,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pTVar28);
                    ::std::__cxx11::string::operator=((string *)pTVar28,(string *)local_4c8);
                    if (local_4c8 != (undefined1  [8])&local_4b8) {
                      operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                    }
                    if (local_498 != (undefined1  [8])(local_498 + 0x10)) {
                      operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                  ::std::ios_base::~ios_base(local_338);
                  iVar11 = 1;
                  goto LAB_0023bafd;
                }
              }
              if (local_4f8._8_8_ != (long)local_4e8 + 8) {
                operator_delete((void *)local_4f8._8_8_,
                                CONCAT44(local_4e8._12_4_,
                                         CONCAT13(local_4e8[0xb],
                                                  CONCAT12(local_4e8[10],
                                                           CONCAT11(local_4e8[9],local_4e8[8])))) +
                                1);
              }
              if (!bVar10) goto LAB_0023bcfc;
              cVar17 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_418,(key_type *)__k);
              p_Var2 = &local_418._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar17._M_node == p_Var2) {
                this = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                     *)local_1b8._8_8_,(key_type *)__k);
                Property::operator=(this,prop);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_418,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar17 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_418,(key_type *)__k);
              if ((_Rb_tree_header *)cVar17._M_node == p_Var2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a8,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"():",3);
                poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_3a8,0x1004);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4f8,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3a8,(char *)local_4f8._0_8_,local_4f8._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                  operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                }
                pTVar28 = local_470;
                if (local_468 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_4f8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_4c8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pTVar28);
                  ::std::__cxx11::string::operator=((string *)local_468,(string *)local_4f8);
                  if ((undefined1 *)local_4f8._0_8_ != local_4e8) {
                    operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
                  }
                  if (local_4c8 != (undefined1  [8])&local_4b8) {
                    operator_delete((void *)local_4c8,local_4b8._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                ::std::ios_base::~ios_base(local_338);
              }
            }
          }
        }
      }
      else {
LAB_0023bcfc:
        if ((iVar11 != 3) && (iVar11 != 0)) {
          bVar10 = false;
          goto LAB_0023c3bc;
        }
      }
LAB_0023bd0b:
      p_Var18 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18);
    } while (p_Var18 != local_170);
    bVar10 = true;
  }
LAB_0023c3bc:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_418,(_Link_type)local_418._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar10;
}

Assistant:

bool ReconstructShader<UsdUVTexture>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdUVTexture *texture,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;

  auto SourceColorSpaceHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::SourceColorSpace, std::string> {
    using EnumTy = std::pair<UsdUVTexture::SourceColorSpace, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::SourceColorSpace::Auto, "auto"),
        std::make_pair(UsdUVTexture::SourceColorSpace::Raw, "raw"),
        std::make_pair(UsdUVTexture::SourceColorSpace::SRGB, "sRGB"),
    };

    return EnumHandler<UsdUVTexture::SourceColorSpace>(
        "inputs:sourceColorSpace", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::Wrap, std::string> {
    using EnumTy = std::pair<UsdUVTexture::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::Wrap::UseMetadata, "useMetadata"),
        std::make_pair(UsdUVTexture::Wrap::Black, "black"),
        std::make_pair(UsdUVTexture::Wrap::Clamp, "clamp"),
        std::make_pair(UsdUVTexture::Wrap::Repeat, "repeat"),
        std::make_pair(UsdUVTexture::Wrap::Mirror, "mirror"),
    };

    return EnumHandler<UsdUVTexture::Wrap>(
        "inputs:wrap*", tok, enums);
  };

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    DCOUT("prop.name = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:file", UsdUVTexture, texture->file)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:st", UsdUVTexture,
                          texture->st)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:sourceColorSpace",
                       UsdUVTexture::SourceColorSpace, SourceColorSpaceHandler, UsdUVTexture,
                       texture->sourceColorSpace, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapS",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapS, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapT",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapT, options.strict_allowedToken_check)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:r", UsdUVTexture,
                                  texture->outputsR)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:g", UsdUVTexture,
                                  texture->outputsG)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:b", UsdUVTexture,
                                  texture->outputsB)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:a", UsdUVTexture,
                                  texture->outputsA)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:rgb", UsdUVTexture,
                                  texture->outputsRGB)
    ADD_PROPERTY(table, prop, UsdUVTexture, texture->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("UsdUVTexture reconstructed.");
  return true;
}